

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

nid_type __thiscall
AddrManImpl::GetEntry(AddrManImpl *this,bool use_tried,size_t bucket,size_t position)

{
  long lVar1;
  bool *pbVar2;
  bool *in_RCX;
  long in_RDX;
  byte in_SIL;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar3;
  nid_type local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      )),in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
             (AnnotatedMixin<std::mutex> *)0xee6ca0);
  if ((in_SIL & 1) == 0) {
    pbVar2 = inline_assertion_check<false,bool>
                       (in_RCX,in_RDI,
                        CONCAT13(in_stack_ffffffffffffffbf,
                                 CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)),
                        in_stack_ffffffffffffffb0,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar3 = 0;
    if ((*pbVar2 & 1U) != 0) {
      pbVar2 = inline_assertion_check<false,bool>
                         (in_RCX,in_RDI,
                          CONCAT13(in_stack_ffffffffffffffbf,(uint3)in_stack_ffffffffffffffbc),
                          in_stack_ffffffffffffffb0,
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bVar3 = *pbVar2;
    }
    if ((bVar3 & 1) != 0) {
      local_18 = *(nid_type *)(in_RDI + (long)in_RCX * 8 + in_RDX * 0x200 + 0x20180);
      goto LAB_00ee6e1a;
    }
  }
  else {
    pbVar2 = inline_assertion_check<false,bool>
                       (in_RCX,in_RDI,
                        CONCAT13(in_stack_ffffffffffffffbf,
                                 CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)),
                        in_stack_ffffffffffffffb0,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar3 = 0;
    if ((*pbVar2 & 1U) != 0) {
      pbVar2 = inline_assertion_check<false,bool>
                         (in_RCX,in_RDI,
                          (uint)CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc),
                          in_stack_ffffffffffffffb0,
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bVar3 = *pbVar2;
    }
    if ((bVar3 & 1) != 0) {
      local_18 = *(nid_type *)(in_RDI + (long)in_RCX * 8 + in_RDX * 0x200 + 0x178);
      goto LAB_00ee6e1a;
    }
  }
  local_18 = -1;
LAB_00ee6e1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

nid_type AddrManImpl::GetEntry(bool use_tried, size_t bucket, size_t position) const
{
    AssertLockHeld(cs);

    if (use_tried) {
        if (Assume(position < ADDRMAN_BUCKET_SIZE) && Assume(bucket < ADDRMAN_TRIED_BUCKET_COUNT)) {
            return vvTried[bucket][position];
        }
    } else {
        if (Assume(position < ADDRMAN_BUCKET_SIZE) && Assume(bucket < ADDRMAN_NEW_BUCKET_COUNT)) {
            return vvNew[bucket][position];
        }
    }

    return -1;
}